

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O0

void Sim_ManStop(Sim_Man_t *p)

{
  Sim_Man_t *p_local;
  
  if (p->vSim0 != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSim0);
  }
  if (p->vSim1 != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSim1);
  }
  if (p->vSuppStr != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSuppStr);
  }
  if (p->vSuppTargs != (Vec_Vec_t *)0x0) {
    Vec_VecFree(p->vSuppTargs);
  }
  if (p->pMmPat != (Extra_MmFixed_t *)0x0) {
    Extra_MmFixedStop(p->pMmPat);
  }
  if (p->vFifo != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vFifo);
  }
  if (p->vDiffs != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vDiffs);
  }
  if (p != (Sim_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Sim_ManStop( Sim_Man_t * p )
{
    // Sim_ManPrintStats( p );
    if ( p->vSim0 )        Sim_UtilInfoFree( p->vSim0 );       
    if ( p->vSim1 )        Sim_UtilInfoFree( p->vSim1 );       
    if ( p->vSuppStr )     Sim_UtilInfoFree( p->vSuppStr );    
//    if ( p->vSuppFun )     Sim_UtilInfoFree( p->vSuppFun );    
    if ( p->vSuppTargs )   Vec_VecFree( p->vSuppTargs );
    if ( p->pMmPat )       Extra_MmFixedStop( p->pMmPat );
    if ( p->vFifo )        Vec_PtrFree( p->vFifo );
    if ( p->vDiffs )       Vec_IntFree( p->vDiffs );
    ABC_FREE( p );
}